

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImPlotPlot * __thiscall ImPool<ImPlotPlot>::Add(ImPool<ImPlotPlot> *this)

{
  int i;
  ImGuiID IVar1;
  ImPlotPlot *pIVar2;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImPlotPlot>::resize(&this->Buf,i + 1);
    IVar1 = this->FreeIdx + 1;
  }
  else {
    pIVar2 = ImVector<ImPlotPlot>::operator[](&this->Buf,i);
    IVar1 = pIVar2->ID;
  }
  this->FreeIdx = IVar1;
  pIVar2 = ImVector<ImPlotPlot>::operator[](&this->Buf,i);
  ImPlotPlot::ImPlotPlot(pIVar2);
  this->AliveCount = this->AliveCount + 1;
  pIVar2 = ImVector<ImPlotPlot>::operator[](&this->Buf,i);
  return pIVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); AliveCount++; return &Buf[idx]; }